

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeZ.cpp
# Opt level: O0

void __thiscall OpenMD::ChargeZ::writeChargeZ(ChargeZ *this)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  size_type sVar5;
  reference pdVar6;
  char *pcVar7;
  ostream *poVar8;
  size_type sVar9;
  reference pvVar10;
  undefined8 uVar11;
  long in_RDI;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  RealType volSlice;
  RealType z;
  uint i;
  RealType binCharge;
  ofstream rdfStream;
  RealType areaAve;
  RealType areaSum;
  RealType zAve;
  RealType zSum;
  iterator j;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcc8;
  errorStruct *peVar18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffcd0;
  uint local_26c;
  ostream local_250 [512];
  double local_50;
  double *local_48;
  double *local_40;
  double local_38;
  double local_30;
  double *local_28;
  double *local_20;
  double local_18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_10 [2];
  
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
  __normal_iterator(local_10);
  local_18 = 0.0;
  local_20 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffcc8);
  local_10[0]._M_current = local_20;
  while( true ) {
    local_28 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffcc8);
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffcd0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffcc8);
    local_30 = local_18;
    if (!bVar3) break;
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_10);
    local_18 = *pdVar6 + local_18;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_10);
  }
  sVar5 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748));
  auVar14._8_4_ = (int)(sVar5 >> 0x20);
  auVar14._0_8_ = sVar5;
  auVar14._12_4_ = 0x45300000;
  local_30 = local_30 /
             ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
  local_38 = 0.0;
  local_40 = (double *)
             std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffcc8);
  local_10[0]._M_current = local_40;
  while( true ) {
    local_48 = (double *)
               std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffcc8);
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffcd0,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffcc8);
    local_50 = local_38;
    if (!bVar3) break;
    pdVar6 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_10);
    local_38 = *pdVar6 + local_38;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(local_10);
  }
  sVar5 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x760));
  auVar15._8_4_ = (int)(sVar5 >> 0x20);
  auVar15._0_8_ = sVar5;
  auVar15._12_4_ = 0x45300000;
  local_50 = local_50 /
             ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_250,pcVar7,_S_out);
  bVar4 = std::ofstream::is_open();
  if ((bVar4 & 1) == 0) {
    uVar11 = std::__cxx11::string::c_str();
    peVar18 = &painCave;
    snprintf(painCave.errMsg,2000,"ChargeZ: unable to open %s\n",uVar11);
    peVar18->isFatal = 1;
    simError();
  }
  else {
    poVar8 = std::operator<<(local_250,"#ChargeZ ");
    std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(local_250,"#selection: (");
    poVar8 = std::operator<<(poVar8,(string *)(in_RDI + 0xd8));
    std::operator<<(poVar8,")\n");
    poVar8 = std::operator<<(local_250,"#");
    poVar8 = std::operator<<(poVar8,(string *)(in_RDI + 0x798));
    std::operator<<(poVar8,"\tcharge\n");
    for (local_26c = 0;
        sVar5 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x778)),
        local_26c < sVar5; local_26c = local_26c + 1) {
      dVar12 = local_30 * ((double)local_26c + 0.5);
      sVar5 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x778));
      auVar16._8_4_ = (int)(sVar5 >> 0x20);
      auVar16._0_8_ = sVar5;
      auVar16._12_4_ = 0x45300000;
      dVar13 = local_50 * local_30;
      sVar9 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x748));
      auVar17._8_4_ = (int)(sVar9 >> 0x20);
      auVar17._0_8_ = sVar9;
      auVar17._12_4_ = 0x45300000;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x778),
                           (ulong)local_26c);
      dVar1 = *pvVar10;
      iVar2 = *(int *)(in_RDI + 0xd0);
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (local_250,
                          dVar12 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)));
      poVar8 = std::operator<<(poVar8,"\t");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,dVar1 / ((dVar13 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                                                    ((double)CONCAT44(0x43300000,(int)sVar9) -
                                                    4503599627370496.0))) * (double)iVar2));
      std::operator<<(poVar8,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_250);
  return;
}

Assistant:

void ChargeZ::writeChargeZ() {
    // compute average box length:
    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    RealType areaSum = 0.0;
    for (j = areas_.begin(); j != areas_.end(); ++j) {
      areaSum += *j;
    }
    RealType areaAve = areaSum / areas_.size();

    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#ChargeZ "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#" << axisLabel_ << "\tcharge\n";
      RealType binCharge;
      for (unsigned int i = 0; i < chargeZ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / chargeZ_.size();

        RealType volSlice = areaAve * zAve / zBox_.size();

        binCharge = chargeZ_[i] / (volSlice * nProcessed_);

        rdfStream << z << "\t" << binCharge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ChargeZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }